

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateExtension
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  char *pcVar1;
  Printer *this_00;
  bool bVar2;
  Type TVar3;
  long *plVar4;
  string *field_00;
  size_type *psVar5;
  FileDescriptor *pFVar6;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int iVar7;
  int i;
  int i_00;
  GeneratorOptions *extraout_RDX;
  GeneratorOptions *extraout_RDX_00;
  GeneratorOptions *options_00;
  GeneratorOptions *options_01;
  GeneratorOptions *options_02;
  GeneratorOptions *options_03;
  GeneratorOptions *options_04;
  GeneratorOptions *options_05;
  char *pcVar8;
  Descriptor *pDVar9;
  BytesMode bytes_mode;
  string local_1a8;
  GeneratorOptions *local_188;
  string local_180;
  int local_160;
  int local_15c;
  string local_158;
  string local_138;
  Printer *local_118;
  string local_110;
  string local_f0;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  string extension_scope;
  string local_90;
  string local_70;
  string local_50;
  
  field_00 = &local_1a8;
  pDVar9 = *(Descriptor **)(field + 0x68);
  local_188 = options;
  if (pDVar9 == (Descriptor *)0x0) {
    pDVar9 = *(Descriptor **)(field + 0x30);
    (anonymous_namespace)::GetFilePath_abi_cxx11_
              (&extension_scope,
               (_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
               (GeneratorOptions *)(options->namespace_prefix)._M_string_length,
               (FileDescriptor *)pDVar9);
    options_00 = extraout_RDX_00;
  }
  else {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&extension_scope,
               (_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
               (GeneratorOptions *)(options->namespace_prefix)._M_string_length,pDVar9);
    options_00 = extraout_RDX;
  }
  bytes_mode = 0x220767;
  (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
            (&local_1a8,(_anonymous_namespace_ *)field,options_00,(FieldDescriptor *)pDVar9);
  (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
            (&local_180,(_anonymous_namespace_ *)local_188,(GeneratorOptions *)field,
             (FieldDescriptor *)0x0,true,false,false,bytes_mode);
  io::Printer::Print(printer,
                     "\n/**\n * A tuple of {field number, class constructor} for the extension\n * field named `$name$`.\n * @type {!jspb.ExtensionFieldInfo.<$extensionType$>}\n */\n$class$.$name$ = new jspb.ExtensionFieldInfo(\n"
                     ,"name",&local_1a8,"class",&extension_scope,"extensionType",&local_180);
  iVar7 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    iVar7 = extraout_EDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    iVar7 = extraout_EDX_01;
  }
  SimpleItoa_abi_cxx11_(&local_1a8,(protobuf *)(ulong)*(uint *)(field + 0x38),iVar7);
  (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
            (&local_180,(_anonymous_namespace_ *)field,options_01,(FieldDescriptor *)field_00);
  TVar3 = FieldDescriptor::type(field);
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4) == 10) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_158,(_anonymous_namespace_ *)local_188,(GeneratorOptions *)field,
               (FieldDescriptor *)field_00);
  }
  else {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"null","");
  }
  TVar3 = FieldDescriptor::type(field);
  iVar7 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4);
  if (iVar7 == 10) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)local_188,(GeneratorOptions *)field,
               (FieldDescriptor *)field_00);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_138.field_2._M_allocated_capacity = *psVar5;
      local_138.field_2._8_8_ = plVar4[3];
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar5;
      local_138._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_138._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
  }
  else {
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"null","");
  }
  pcVar8 = ", 0";
  if (*(int *)(field + 0x4c) == 3) {
    pcVar8 = ", 1";
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  pcVar1 = ", 0";
  if (*(int *)(field + 0x4c) == 3) {
    pcVar1 = ", 1";
  }
  local_118 = printer;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,pcVar8 + 2,pcVar1 + 3);
  pDVar9 = (Descriptor *)0x35c467;
  io::Printer::Print(local_118,
                     "    $index$,\n    {$name$: 0},\n    $ctor$,\n     /** @type {?function((boolean|undefined),!jspb.Message=): !Object} */ (\n         $toObject$),\n    $repeated$);\n"
                     ,"index",&local_1a8,"name",&local_180,"ctor",&local_158,"toObject",&local_138,
                     "repeated",&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((iVar7 == 10) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  pFVar6 = *(FileDescriptor **)(field + 0x58);
  (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
            (&local_1a8,(_anonymous_namespace_ *)local_188,*(GeneratorOptions **)(field + 0x30),
             pFVar6,pDVar9);
  SimpleItoa_abi_cxx11_(&local_180,(protobuf *)(ulong)*(uint *)(field + 0x38),i);
  (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
            (&local_158,(_anonymous_namespace_ *)field,options_02,(FieldDescriptor *)pFVar6);
  (anonymous_namespace)::JSBinaryReaderMethodName_abi_cxx11_
            (&local_138,(_anonymous_namespace_ *)field,options_03,(FieldDescriptor *)pFVar6);
  (anonymous_namespace)::JSBinaryWriterMethodName_abi_cxx11_
            (&local_110,(_anonymous_namespace_ *)field,options_04,(FieldDescriptor *)pFVar6);
  TVar3 = FieldDescriptor::type(field);
  local_15c = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4);
  if (local_15c == 10) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_70,(_anonymous_namespace_ *)local_188,(GeneratorOptions *)field,
               (FieldDescriptor *)pFVar6);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_d0._0_8_ = local_d0 + 0x10;
    pFVar6 = (FileDescriptor *)(plVar4 + 2);
    if ((FieldDescriptor *)*plVar4 == (FieldDescriptor *)pFVar6) {
      local_c0._M_allocated_capacity = *(undefined8 *)pFVar6;
      local_c0._8_8_ = plVar4[3];
    }
    else {
      local_c0._M_allocated_capacity = *(undefined8 *)pFVar6;
      local_d0._0_8_ = (FieldDescriptor *)*plVar4;
    }
    local_d0._8_8_ = plVar4[1];
    *plVar4 = (long)pFVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
  }
  else {
    local_d0._0_8_ = local_d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"undefined","");
  }
  TVar3 = FieldDescriptor::type(field);
  local_160 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4);
  if (local_160 == 10) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_90,(_anonymous_namespace_ *)local_188,(GeneratorOptions *)field,
               (FieldDescriptor *)pFVar6);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_f0.field_2._M_allocated_capacity = *psVar5;
      local_f0.field_2._8_8_ = plVar4[3];
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar5;
      local_f0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_f0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
  }
  else {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"undefined","");
  }
  pDVar9 = (Descriptor *)0x3616af;
  io::Printer::Print(local_118,
                     "\n$extendName$Binary[$index$] = new jspb.ExtensionFieldBinaryInfo(\n    $class$.$name$,\n    $binaryReaderFn$,\n    $binaryWriterFn$,\n    $binaryMessageSerializeFn$,\n    $binaryMessageDeserializeFn$,\n"
                     ,"extendName",&local_1a8,"index",&local_180,"class",&extension_scope,"name",
                     &local_158,"binaryReaderFn",&local_138,"binaryWriterFn",&local_110,
                     "binaryMessageSerializeFn",(string *)local_d0,"binaryMessageDeserializeFn",
                     &local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  this_00 = local_118;
  if ((local_160 == 10) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2)) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((FieldDescriptor *)local_d0._0_8_ != (FieldDescriptor *)(local_d0 + 0x10)) {
    operator_delete((void *)local_d0._0_8_,local_c0._M_allocated_capacity + 1);
  }
  if ((local_15c == 10) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  bVar2 = FieldDescriptor::is_packed(field);
  pcVar8 = "false";
  if (bVar2) {
    pcVar8 = "true";
  }
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,pcVar8,pcVar8 + ((ulong)bVar2 ^ 5));
  io::Printer::Print(this_00,"    $isPacked$);\n","isPacked",&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  pFVar6 = *(FileDescriptor **)(field + 0x58);
  (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
            (&local_1a8,(_anonymous_namespace_ *)local_188,*(GeneratorOptions **)(field + 0x30),
             pFVar6,pDVar9);
  SimpleItoa_abi_cxx11_(&local_180,(protobuf *)(ulong)*(uint *)(field + 0x38),i_00);
  (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
            (&local_158,(_anonymous_namespace_ *)field,options_05,(FieldDescriptor *)pFVar6);
  io::Printer::Print(this_00,
                     "// This registers the extension field with the extended class, so that\n// toObject() will function correctly.\n$extendName$[$index$] = $class$.$name$;\n\n"
                     ,"extendName",&local_1a8,"index",&local_180,"class",&extension_scope,"name",
                     &local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)extension_scope._M_dataplus._M_p != &extension_scope.field_2) {
    operator_delete(extension_scope._M_dataplus._M_p,
                    extension_scope.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Generator::GenerateExtension(const GeneratorOptions& options,
                                  io::Printer* printer,
                                  const FieldDescriptor* field) const {
  string extension_scope =
      (field->extension_scope()
           ? GetMessagePath(options, field->extension_scope())
           : GetFilePath(options, field->file()));

  printer->Print(
      "\n"
      "/**\n"
      " * A tuple of {field number, class constructor} for the extension\n"
      " * field named `$name$`.\n"
      " * @type {!jspb.ExtensionFieldInfo.<$extensionType$>}\n"
      " */\n"
      "$class$.$name$ = new jspb.ExtensionFieldInfo(\n",
      "name", JSObjectFieldName(options, field),
      "class", extension_scope,
      "extensionType", JSFieldTypeAnnotation(
          options, field,
          /* is_setter_argument = */ false,
          /* force_present = */ true,
          /* singular_if_not_packed = */ false));
  printer->Print(
      "    $index$,\n"
      "    {$name$: 0},\n"
      "    $ctor$,\n"
      "     /** @type {?function((boolean|undefined),!jspb.Message=): "
      "!Object} */ (\n"
      "         $toObject$),\n"
      "    $repeated$);\n",
      "index", SimpleItoa(field->number()),
      "name", JSObjectFieldName(options, field),
      "ctor", (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ?
               SubmessageTypeRef(options, field) : string("null")),
      "toObject", (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ?
                   (SubmessageTypeRef(options, field) + ".toObject") :
                   string("null")),
      "repeated", (field->is_repeated() ? "1" : "0"));

  printer->Print(
      "\n"
      "$extendName$Binary[$index$] = new jspb.ExtensionFieldBinaryInfo(\n"
      "    $class$.$name$,\n"
      "    $binaryReaderFn$,\n"
      "    $binaryWriterFn$,\n"
      "    $binaryMessageSerializeFn$,\n"
      "    $binaryMessageDeserializeFn$,\n",
      "extendName",
      JSExtensionsObjectName(options, field->file(), field->containing_type()),
      "index", SimpleItoa(field->number()), "class", extension_scope, "name",
      JSObjectFieldName(options, field), "binaryReaderFn",
      JSBinaryReaderMethodName(options, field), "binaryWriterFn",
      JSBinaryWriterMethodName(options, field), "binaryMessageSerializeFn",
      (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE)
          ? (SubmessageTypeRef(options, field) + ".serializeBinaryToWriter")
          : "undefined",
      "binaryMessageDeserializeFn",
      (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE)
          ? (SubmessageTypeRef(options, field) + ".deserializeBinaryFromReader")
          : "undefined");

  printer->Print("    $isPacked$);\n", "isPacked",
                 (field->is_packed() ? "true" : "false"));

  printer->Print(
      "// This registers the extension field with the extended class, so that\n"
      "// toObject() will function correctly.\n"
      "$extendName$[$index$] = $class$.$name$;\n"
      "\n",
      "extendName", JSExtensionsObjectName(options, field->file(),
                                           field->containing_type()),
      "index", SimpleItoa(field->number()),
      "class", extension_scope,
      "name", JSObjectFieldName(options, field));
}